

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall spectest::JSONParser::ParseModuleType(JSONParser *this,ModuleType *out_type)

{
  Result RVar1;
  int iVar2;
  Enum EVar3;
  string module_type_str;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  RVar1 = ParseKeyStringValue(this,"module_type",&local_40);
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    iVar2 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar2 == 0) {
      *out_type = Text;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_40);
      if (iVar2 != 0) {
        PrintError(this,"unknown module type: \"%s\"",local_40._M_dataplus._M_p);
        goto LAB_0016d96e;
      }
      *out_type = Binary;
    }
    EVar3 = Ok;
  }
LAB_0016d96e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (Result)EVar3;
}

Assistant:

wabt::Result JSONParser::ParseModuleType(ModuleType* out_type) {
  std::string module_type_str;

  PARSE_KEY_STRING_VALUE("module_type", &module_type_str);
  if (module_type_str == "text") {
    *out_type = ModuleType::Text;
    return wabt::Result::Ok;
  } else if (module_type_str == "binary") {
    *out_type = ModuleType::Binary;
    return wabt::Result::Ok;
  } else {
    PrintError("unknown module type: \"%s\"", module_type_str.c_str());
    return wabt::Result::Error;
  }
}